

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

Vec_Int_t * Saig_ManCbaFindReason(Saig_ManCba_t *p)

{
  Aig_Man_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_01;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Vec_Int_t *vReasons_00;
  bool local_61;
  int iPrio1;
  int iPrio0;
  int fPhase1;
  int fPhase0;
  int iFrame;
  int iInput;
  int i;
  Vec_Int_t *vReasons;
  Vec_Int_t *vPrios;
  Aig_Obj_t *pObj;
  Saig_ManCba_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pFrames);
  p_01 = Vec_IntStartFull(iVar1);
  pAVar6 = Aig_ManConst1(p->pFrames);
  *(ulong *)&pAVar6->field_0x18 = *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 | 8;
  for (iFrame = 0; iVar1 = Vec_PtrSize(p->pFrames->vCis), iFrame < iVar1; iFrame = iFrame + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pFrames->vCis,iFrame);
    iVar1 = Vec_IntEntry(p->vMapPiF2A,iFrame << 1);
    iVar3 = Vec_IntEntry(p->vMapPiF2A,iFrame * 2 + 1);
    uVar5 = Abc_InfoHasBit((uint *)(p->pCex + 1),p->pCex->nRegs + p->pCex->nPis * iVar3 + iVar1);
    *(ulong *)&pAVar6->field_0x18 =
         *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 | ((ulong)uVar5 & 1) << 3;
    iVar1 = Aig_ObjId(pAVar6);
    Vec_IntWriteEntry(p_01,iVar1,iFrame);
  }
  for (iFrame = 0; iVar1 = Vec_PtrSize(p->pFrames->vObjs), iFrame < iVar1; iFrame = iFrame + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pFrames->vObjs,iFrame);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar6), iVar1 != 0)) {
      uVar5 = Aig_ObjFaninC0(pAVar6);
      pAVar7 = Aig_ObjFanin0(pAVar6);
      uVar5 = uVar5 ^ (uint)(*(ulong *)&pAVar7->field_0x18 >> 3) & 1;
      uVar2 = Aig_ObjFaninC1(pAVar6);
      pAVar7 = Aig_ObjFanin1(pAVar6);
      uVar2 = uVar2 ^ (uint)(*(ulong *)&pAVar7->field_0x18 >> 3) & 1;
      iVar1 = Aig_ObjFaninId0(pAVar6);
      iVar1 = Vec_IntEntry(p_01,iVar1);
      iVar3 = Aig_ObjFaninId1(pAVar6);
      iVar3 = Vec_IntEntry(p_01,iVar3);
      local_61 = uVar5 != 0 && uVar2 != 0;
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 | (ulong)local_61 << 3;
      if ((uVar5 == 0) || (uVar2 == 0)) {
        if ((uVar5 == 0) && (uVar2 != 0)) {
          iVar3 = Aig_ObjId(pAVar6);
          Vec_IntWriteEntry(p_01,iVar3,iVar1);
        }
        else if ((uVar5 == 0) || (uVar2 != 0)) {
          iVar4 = Aig_ObjId(pAVar6);
          iVar1 = Abc_MinInt(iVar1,iVar3);
          Vec_IntWriteEntry(p_01,iVar4,iVar1);
        }
        else {
          iVar1 = Aig_ObjId(pAVar6);
          Vec_IntWriteEntry(p_01,iVar1,iVar3);
        }
      }
      else {
        iVar4 = Aig_ObjId(pAVar6);
        iVar1 = Abc_MaxInt(iVar1,iVar3);
        Vec_IntWriteEntry(p_01,iVar4,iVar1);
      }
    }
  }
  pAVar6 = Aig_ManCo(p->pFrames,0);
  uVar5 = Aig_ObjFaninC0(pAVar6);
  pAVar7 = Aig_ObjFanin0(pAVar6);
  *(ulong *)&pAVar6->field_0x18 =
       *(ulong *)&pAVar6->field_0x18 & 0xfffffffffffffff7 |
       ((ulong)(uVar5 ^ (uint)(*(ulong *)&pAVar7->field_0x18 >> 3) & 1) & 1) << 3;
  if ((*(ulong *)&pAVar6->field_0x18 >> 3 & 1) != 0) {
    __assert_fail("!pObj->fPhase",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x15c,"Vec_Int_t *Saig_ManCbaFindReason(Saig_ManCba_t *)");
  }
  vReasons_00 = Vec_IntAlloc(100);
  Aig_ManIncrementTravId(p->pFrames);
  p_00 = p->pFrames;
  pAVar6 = Aig_ObjFanin0(pAVar6);
  Saig_ManCbaFindReason_rec(p_00,pAVar6,p_01,vReasons_00);
  Vec_IntFree(p_01);
  return vReasons_00;
}

Assistant:

Vec_Int_t * Saig_ManCbaFindReason( Saig_ManCba_t * p )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vPrios, * vReasons;
    int i;

    // set PI values according to CEX
    vPrios = Vec_IntStartFull( Aig_ManObjNumMax(p->pFrames) );
    Aig_ManConst1(p->pFrames)->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), i );
    }

    // traverse and set the priority
    Aig_ManForEachNode( p->pFrames, pObj, i )
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        int iPrio0  = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
        int iPrio1  = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
        pObj->fPhase = fPhase0 && fPhase1;
        if ( fPhase0 && fPhase1 ) // both are one
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MaxInt(iPrio0, iPrio1) );
        else if ( !fPhase0 && fPhase1 ) 
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio0 );
        else if ( fPhase0 && !fPhase1 )
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), iPrio1 );
        else // both are zero
            Vec_IntWriteEntry( vPrios, Aig_ObjId(pObj), Abc_MinInt(iPrio0, iPrio1) );
    }
    // check the property output
    pObj = Aig_ManCo( p->pFrames, 0 );
    pObj->fPhase = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
    assert( !pObj->fPhase );

    // select the reason
    vReasons = Vec_IntAlloc( 100 );
    Aig_ManIncrementTravId( p->pFrames );
    Saig_ManCbaFindReason_rec( p->pFrames, Aig_ObjFanin0(pObj), vPrios, vReasons );
    Vec_IntFree( vPrios );
//    assert( !Aig_ObjIsTravIdCurrent(p->pFrames, Aig_ManConst1(p->pFrames)) );
    return vReasons;
}